

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

char absl::lts_20250127::str_format_internal::anon_unknown_0::DivideBy10WithCarry
               (uint64_t *v,char carry)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint64_t next_carry;
  uint64_t mod;
  uint64_t carry_u64;
  uint64_t chunk_remainder;
  uint64_t chunk_quotient;
  uint64_t divisor;
  char carry_local;
  uint64_t *v_local;
  
  uVar2 = (long)carry * 6 + *v % 10;
  *v = *v / 10 + (long)carry * 0x1999999999999999 + uVar2 / 10;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  return SUB161(auVar1 % ZEXT816(10),0);
}

Assistant:

inline char DivideBy10WithCarry(uint64_t* v, char carry) {
  constexpr uint64_t divisor = 10;
  // 2^64 / divisor = chunk_quotient + chunk_remainder / divisor
  constexpr uint64_t chunk_quotient = (uint64_t{1} << 63) / (divisor / 2);
  constexpr uint64_t chunk_remainder = uint64_t{} - chunk_quotient * divisor;

  const uint64_t carry_u64 = static_cast<uint64_t>(carry);
  const uint64_t mod = *v % divisor;
  const uint64_t next_carry = chunk_remainder * carry_u64 + mod;
  *v = *v / divisor + carry_u64 * chunk_quotient + next_carry / divisor;
  return static_cast<char>(next_carry % divisor);
}